

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_tracing_libapi.cpp
# Opt level: O1

ze_result_t zelTracerDestroy(zel_tracer_handle_t hTracer)

{
  ze_result_t zVar1;
  
  if ((ze_lib::destruction == '\0') && (*(code **)(ze_lib::context + 0x30) != (code *)0x0)) {
    zVar1 = (**(code **)(ze_lib::context + 0x30))();
    return zVar1;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

ze_result_t ZE_APICALL
zelTracerDestroy(
    zel_tracer_handle_t hTracer                 ///< [in][release] handle of tracer object to destroy
    )
{
    if(ze_lib::destruction)
        return ZE_RESULT_ERROR_UNINITIALIZED;
    auto pfnDestroy = ze_lib::context->zelTracingDdiTable.Tracer.pfnDestroy;
    if( nullptr == pfnDestroy )
        return ZE_RESULT_ERROR_UNINITIALIZED;

    return pfnDestroy( hTracer );
}